

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_document_content(yaml_parser_t *parser,yaml_event_t *event)

{
  yaml_parser_state_t *pyVar1;
  int iVar2;
  yaml_token_t *local_30;
  yaml_token_t *token;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (parser->token_available == 0) {
    iVar2 = yaml_parser_fetch_more_tokens(parser);
    if (iVar2 == 0) {
      local_30 = (yaml_token_t *)0x0;
      goto LAB_00114434;
    }
  }
  local_30 = (parser->tokens).head;
LAB_00114434:
  if (local_30 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else if ((((local_30->type == YAML_VERSION_DIRECTIVE_TOKEN) ||
            (local_30->type == YAML_TAG_DIRECTIVE_TOKEN)) ||
           (local_30->type == YAML_DOCUMENT_START_TOKEN)) ||
          ((local_30->type == YAML_DOCUMENT_END_TOKEN || (local_30->type == YAML_STREAM_END_TOKEN)))
          ) {
    pyVar1 = (parser->states).top;
    (parser->states).top = pyVar1 + -1;
    parser->state = pyVar1[-1];
    parser_local._4_4_ = yaml_parser_process_empty_scalar(parser,event,local_30->start_mark);
  }
  else {
    parser_local._4_4_ = yaml_parser_parse_node(parser,event,1,0);
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_document_content(yaml_parser_t *parser, yaml_event_t *event)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_VERSION_DIRECTIVE_TOKEN ||
            token->type == YAML_TAG_DIRECTIVE_TOKEN ||
            token->type == YAML_DOCUMENT_START_TOKEN ||
            token->type == YAML_DOCUMENT_END_TOKEN ||
            token->type == YAML_STREAM_END_TOKEN) {
        parser->state = POP(parser, parser->states);
        return yaml_parser_process_empty_scalar(parser, event,
                token->start_mark);
    }
    else {
        return yaml_parser_parse_node(parser, event, 1, 0);
    }
}